

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,ArrayPtr<const_unsigned_char> *params)

{
  int iVar1;
  uchar *puVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  ArrayPtr<const_unsigned_char> *pAVar7;
  ArrayPtr<const_unsigned_char> *in_R8;
  uint uVar8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  
  pAVar7 = table.ptr;
  aVar6.value = table.size_;
  if (pAVar7[1].size_ != 0) {
    uVar4 = hashCode<kj::ArrayPtr<unsigned_char_const>&>((StringPtr *)in_R8);
    sVar5 = pAVar7[1].size_;
    uVar8 = (int)sVar5 - 1U & uVar4;
    aVar6 = extraout_RDX;
    while( true ) {
      uVar9 = (ulong)uVar8;
      puVar2 = pAVar7[1].ptr;
      iVar1 = *(int *)(puVar2 + uVar9 * 8 + 4);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)(puVar2 + uVar9 * 8) == uVar4)) {
        bVar3 = ArrayPtr<const_unsigned_char>::operator==
                          ((ArrayPtr<const_unsigned_char> *)
                           ((ulong)(iVar1 - 2) * 0x10 + table.size_),in_R8);
        aVar6 = extraout_RDX_00;
        if (bVar3) {
          iVar1 = *(int *)(puVar2 + uVar9 * 8 + 4);
          *(undefined1 *)this = 1;
          this->erasedCount = (ulong)(iVar1 - 2);
          goto LAB_0030ba00;
        }
        sVar5 = pAVar7[1].size_;
      }
      uVar8 = (uint)(uVar9 + 1);
      if (uVar9 + 1 == sVar5) {
        uVar8 = 0;
      }
    }
  }
  *(undefined1 *)this = 0;
LAB_0030ba00:
  MVar10.ptr.field_1.value = aVar6.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }